

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex.cpp
# Opt level: O0

void __thiscall tinygraph::Vertex::~Vertex(Vertex *this)

{
  Vertex *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&this->properties);
  std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
  ::~vector(&this->connections);
  std::shared_ptr<tinygraph::Type>::~shared_ptr(&this->type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Vertex::~Vertex() = default;